

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Assign<duckdb::date_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>>
               (ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *state,date_t *x,string_t *y,
               bool x_null)

{
  string_t new_value;
  string_t *in_RSI;
  long in_RDI;
  undefined8 unaff_retaddr;
  
  ArgMinMaxStateBase::AssignValue<duckdb::date_t>
            ((date_t *)(in_RDI + 4),(date_t)(in_RSI->value).pointer.length);
  new_value.value.pointer.ptr = (char *)unaff_retaddr;
  new_value.value._0_8_ = in_RDI;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>(in_RSI,new_value);
  return;
}

Assistant:

static void Assign(STATE &state, const A_TYPE &x, const B_TYPE &y, const bool x_null) {
		if (IGNORE_NULL) {
			STATE::template AssignValue<A_TYPE>(state.arg, x);
			STATE::template AssignValue<B_TYPE>(state.value, y);
		} else {
			state.arg_null = x_null;
			if (!state.arg_null) {
				STATE::template AssignValue<A_TYPE>(state.arg, x);
			}
			STATE::template AssignValue<B_TYPE>(state.value, y);
		}
	}